

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::setup_meta_chain
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id,uint32_t var_id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  mapped_type *pmVar4;
  mapped_type *ppPVar5;
  __node_gen_type __node_gen;
  uint32_t local_28;
  uint32_t local_24;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_20;
  
  local_28 = type_id;
  local_24 = var_id;
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + type_id)
  ;
  if ((*(int *)&(pSVar3->super_IVariant).field_0xc == 0x20) &&
     (pSVar3->storage == PhysicalStorageBuffer)) {
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->physical_block_type_meta,&local_28);
    ppPVar5 = ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->access_chain_to_physical_block,&local_24);
    *ppPVar5 = pmVar4;
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        local_28);
    bVar1 = is_physical_pointer_to_buffer_block(this->compiler,pSVar3);
    if (!bVar1) {
      local_20 = &this->non_block_types;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_20,&local_28);
    }
    if (pmVar4->alignment == 0) {
      pSVar3 = get_pointee_type(this->compiler,pSVar3);
      uVar2 = get_minimum_scalar_alignment(this,pSVar3);
      pmVar4->alignment = uVar2;
    }
  }
  return;
}

Assistant:

void Compiler::PhysicalStorageBufferPointerHandler::setup_meta_chain(uint32_t type_id, uint32_t var_id)
{
	if (type_is_bda_block_entry(type_id))
	{
		auto &meta = physical_block_type_meta[type_id];
		access_chain_to_physical_block[var_id] = &meta;

		auto &type = compiler.get<SPIRType>(type_id);

		if (!compiler.is_physical_pointer_to_buffer_block(type))
			non_block_types.insert(type_id);

		if (meta.alignment == 0)
			meta.alignment = get_minimum_scalar_alignment(compiler.get_pointee_type(type));
	}
}